

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void nullcPrintAutoInfo(char *ptr,uint indentDepth)

{
  void *ptr_00;
  char *pcVar1;
  ExternTypeInfo *pEVar2;
  void *pvVar3;
  uint uVar4;
  
  pcVar1 = nullcDebugSymbols((uint *)0x0);
  pEVar2 = nullcDebugTypeInfo((uint *)0x0);
  ptr_00 = *(void **)(ptr + 4);
  uVar4 = indentDepth;
  if (indentDepth == 0) {
    printf("typeid type = %d (%s)\n",(long)*(int *)ptr,pcVar1 + pEVar2[*(int *)ptr].offsetToName);
  }
  else {
    do {
      printf("  ");
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    printf("typeid type = %d (%s)\n",(long)*(int *)ptr,pcVar1 + pEVar2[*(int *)ptr].offsetToName);
    do {
      printf("  ");
      indentDepth = indentDepth - 1;
    } while (indentDepth != 0);
  }
  printf("%s ref ptr = ",pcVar1 + pEVar2[*(int *)ptr].offsetToName);
  pvVar3 = NULLC::GetBasePointer(ptr_00);
  if (pvVar3 == (void *)0x0) {
    printf("%p\n",ptr_00);
    return;
  }
  printf("%p [base %p, ",ptr_00,pvVar3);
  nullcPrintPointerMarkerInfo(*(markerType *)((long)pvVar3 + -8));
  puts("]");
  return;
}

Assistant:

void nullcPrintAutoInfo(char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);

	void *target = *(void**)(ptr + 4);

	nullcPrintDepthIndent(indentDepth);
	printf("typeid type = %d (%s)\n", *(int*)ptr, codeSymbols + codeTypes[*(int*)(ptr)].offsetToName);
	nullcPrintDepthIndent(indentDepth);
	printf("%s ref ptr = ", codeSymbols + codeTypes[*(int*)(ptr)].offsetToName);

	if(void *base = NULLC::GetBasePointer(target))
	{
		markerType *marker = (markerType*)((char*)base - sizeof(markerType));

		printf("%p [base %p, ", target, base);
		nullcPrintPointerMarkerInfo(*marker);
		printf("]\n");
	}
	else
	{
		printf("%p\n", target);
	}
}